

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O2

void PDHG_PrintUserParamHelper(void)

{
  PDHG_PrintHugeCUPDHG();
  puts("CUPDHG User Parameters:");
  putchar(10);
  puts("    -h: print this helper");
  putchar(10);
  puts("    -nIterLim:  maximum iteration number");
  puts("                type:    int");
  puts("                default: INT_MAX");
  puts("                range:   >= 0");
  putchar(10);
  puts("    -ifScaling: whether to use scaling");
  puts("                type:    bool");
  puts("                default: true");
  puts("                range:   true or false");
  putchar(10);
  puts("    -eLineSearchMethod: which line search method to use");
  puts("                        0-Fixed, 1-Malitsky (not support), 2-Adaptive");
  puts("                type:    int");
  puts("                default: 2");
  puts("                range:   0 to 2");
  putchar(10);
  puts("    -dPrimalTol: primal tolerance");
  puts("                type:    double");
  puts("                default: 1e-4");
  puts("                range:   >= 0");
  putchar(10);
  puts("    -dDualTol: dual tolerance");
  puts("                type:    double");
  puts("                default: 1e-4");
  puts("                range:   >= 0");
  putchar(10);
  puts("    -dGapTol: gap tolerance");
  puts("                type:    double");
  puts("                default: 1e-4");
  puts("                range:   >= 0");
  putchar(10);
  puts("    -dFeasTol: feasibility tolerance");
  puts("                type:    double");
  puts("                default: 1e-8");
  puts("                range:   >= 0");
  putchar(10);
  puts("    -dTimeLim: time limit (in seconds)");
  puts("                type:    double");
  puts("                default: 3600");
  puts("                range:   >= 0");
  putchar(10);
  puts("    -eRestartMethod: which restart method to use");
  puts("                     0-None, 1-KKTversion");
  puts("                type:    int");
  puts("                default: 1");
  puts("                range:   0 to 1");
  putchar(10);
  puts("    -ifRuizScaling: whether to use Ruiz scaling");
  puts("                type:    bool");
  puts("                default: true");
  puts("                range:   true or false");
  putchar(10);
  puts("    -ifL2Scaling: whether to use L2 scaling");
  puts("                type:    bool");
  puts("                default: false");
  puts("                range:   true or false");
  putchar(10);
  puts("    -ifPcScaling: whether to use Pock-Chambolle scaling");
  puts("                type:    bool");
  puts("                default: true");
  puts("                range:   true or false");
  putchar(10);
  return;
}

Assistant:

void PDHG_PrintUserParamHelper(void) {
  PDHG_PrintHugeCUPDHG();

  cupdlp_printf("CUPDHG User Parameters:\n");
  cupdlp_printf("\n");

  cupdlp_printf("    -h: print this helper\n");
  cupdlp_printf("\n");

  cupdlp_printf("    -nIterLim:  maximum iteration number\n");
  cupdlp_printf("                type:    int\n");
  cupdlp_printf("                default: INT_MAX\n");
  cupdlp_printf("                range:   >= 0\n");
  cupdlp_printf("\n");

  cupdlp_printf("    -ifScaling: whether to use scaling\n");
  cupdlp_printf("                type:    bool\n");
  cupdlp_printf("                default: true\n");
  cupdlp_printf("                range:   true or false\n");
  cupdlp_printf("\n");

  cupdlp_printf("    -eLineSearchMethod: which line search method to use\n");
  cupdlp_printf(
      "                        0-Fixed, 1-Malitsky (not support), "
      "2-Adaptive\n");
  cupdlp_printf("                type:    int\n");
  cupdlp_printf("                default: 2\n");
  cupdlp_printf("                range:   0 to 2\n");
  cupdlp_printf("\n");

  cupdlp_printf("    -dPrimalTol: primal tolerance\n");
  cupdlp_printf("                type:    double\n");
  cupdlp_printf("                default: 1e-4\n");
  cupdlp_printf("                range:   >= 0\n");
  cupdlp_printf("\n");

  cupdlp_printf("    -dDualTol: dual tolerance\n");
  cupdlp_printf("                type:    double\n");
  cupdlp_printf("                default: 1e-4\n");
  cupdlp_printf("                range:   >= 0\n");
  cupdlp_printf("\n");

  cupdlp_printf("    -dGapTol: gap tolerance\n");
  cupdlp_printf("                type:    double\n");
  cupdlp_printf("                default: 1e-4\n");
  cupdlp_printf("                range:   >= 0\n");
  cupdlp_printf("\n");

  cupdlp_printf("    -dFeasTol: feasibility tolerance\n");
  cupdlp_printf("                type:    double\n");
  cupdlp_printf("                default: 1e-8\n");
  cupdlp_printf("                range:   >= 0\n");
  cupdlp_printf("\n");

  cupdlp_printf("    -dTimeLim: time limit (in seconds)\n");
  cupdlp_printf("                type:    double\n");
  cupdlp_printf("                default: 3600\n");
  cupdlp_printf("                range:   >= 0\n");
  cupdlp_printf("\n");

  cupdlp_printf("    -eRestartMethod: which restart method to use\n");
  cupdlp_printf("                     0-None, 1-KKTversion\n");
  cupdlp_printf("                type:    int\n");
  cupdlp_printf("                default: 1\n");
  cupdlp_printf("                range:   0 to 1\n");
  cupdlp_printf("\n");

  cupdlp_printf("    -ifRuizScaling: whether to use Ruiz scaling\n");
  cupdlp_printf("                type:    bool\n");
  cupdlp_printf("                default: true\n");
  cupdlp_printf("                range:   true or false\n");
  cupdlp_printf("\n");

  cupdlp_printf("    -ifL2Scaling: whether to use L2 scaling\n");
  cupdlp_printf("                type:    bool\n");
  cupdlp_printf("                default: false\n");
  cupdlp_printf("                range:   true or false\n");
  cupdlp_printf("\n");

  cupdlp_printf("    -ifPcScaling: whether to use Pock-Chambolle scaling\n");
  cupdlp_printf("                type:    bool\n");
  cupdlp_printf("                default: true\n");
  cupdlp_printf("                range:   true or false\n");
  cupdlp_printf("\n");

  // cupdlp_printf(
  //     "    -ifPre: whether to use HiGHS presolver (and thus postsolver)\n");
  // cupdlp_printf("                type:    bool\n");
  // cupdlp_printf("                default: true\n");
  // cupdlp_printf("                range:   true or false\n");
  // cupdlp_printf("\n");
}